

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

NULLCRef * NULLC::CopyObject(NULLCRef ptr)

{
  uint size;
  ExternTypeInfo *pEVar1;
  char *__dest;
  NULLCRef *in_RDI;
  uint in_stack_00000008;
  void *in_stack_0000000c;
  
  in_RDI->typeID = in_stack_00000008;
  pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                     ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),in_stack_00000008
                     );
  size = pEVar1->size;
  __dest = (char *)AllocObject(size,in_stack_00000008);
  in_RDI->ptr = __dest;
  memcpy(__dest,in_stack_0000000c,(ulong)size);
  return in_RDI;
}

Assistant:

NULLCRef NULLC::CopyObject(NULLCRef ptr)
{
	NULLCRef ret;
	ret.typeID = ptr.typeID;
	unsigned int objSize = linker->exTypes[ret.typeID].size;
	ret.ptr = (char*)AllocObject(objSize, ptr.typeID);
	memcpy(ret.ptr, ptr.ptr, objSize);
	return ret;
}